

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O0

void If_CluTest(void)

{
  word Func2;
  word Func1;
  word Func0;
  If_Grp_t R;
  If_Grp_t G2;
  If_Grp_t G;
  int nLutRoot;
  int nLutLeaf2;
  int nLutLeaf;
  int nVars;
  word t;
  
  return;
}

Assistant:

void If_CluTest()
{
//    word t = 0xff00f0f0ccccaaaa;
//    word t = 0xfedcba9876543210;
//    word t = 0xec64000000000000;
//    word t = 0x0100200000000001;
//    word t2[4] = { 0x0000800080008000, 0x8000000000008000, 0x8000000080008000, 0x0000000080008000 };
//    word t = 0x07770FFF07770FFF;
//    word t = 0x002000D000D00020;
//    word t = 0x000F000E000F000F;
//    word t = 0xF7FFF7F7F7F7F7F7;
//    word t = 0x0234AFDE23400BCE;
//    word t = 0x0080008880A088FF;
//    word s = t;
//    word t = 0xFFBBBBFFF0B0B0F0;
    word t = ABC_CONST(0x6DD9926D962D6996);
    int nVars     = 6;
    int nLutLeaf  = 4;
    int nLutLeaf2 = 4;
    int nLutRoot  = 4;
/*
    word t2[2] = { 0x7f807f807f80807f, 0x7f807f807f807f80 };
    int nVars     = 7;
    int nLutLeaf  = 3;
    int nLutLeaf2 = 3;
    int nLutRoot  = 3;
*/

    If_Grp_t G;
    If_Grp_t G2, R;
    word Func0, Func1, Func2;


    return;

/*
    int pCanonPerm[CLU_VAR_MAX];
    int uCanonPhase;

    Kit_DsdPrintFromTruth( (unsigned*)&s, nVars ); printf( "\n" );
    uCanonPhase = If_CluSemiCanonicize( &s, nVars, pCanonPerm );
    Kit_DsdPrintFromTruth( (unsigned*)&s, nVars ); printf( "\n" );

    If_CluSemiCanonicizeVerify( &s, &t, nVars, pCanonPerm, uCanonPhase );
*/

    Kit_DsdPrintFromTruth( (unsigned*)&t, nVars ); printf( "\n" );
    G = If_CluCheck3( NULL, &t, nVars, nLutLeaf, nLutLeaf2, nLutRoot, &R, &G2, &Func0, &Func1, &Func2 );
    If_CluPrintGroup( &G );
    If_CluPrintGroup( &G2 );
    If_CluPrintGroup( &R );

//    If_CluVerify3( &t, nVars, &G, &G2, &R, Func1, Func2, Func0 );

    return;

//    If_CutPerformCheck07( NULL, (unsigned *)&t, 6, 6, NULL );
//    return;

//    Kit_DsdPrintFromTruth( (unsigned*)&t, nVars ); printf( "\n" );
//    G = If_CluCheck( NULL, &t, nVars, 0, nLutLeaf, nLutRoot, NULL, NULL, NULL, NULL, 0 );
//    If_CluPrintGroup( &G );
}